

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int opPrecedence(Fts3Expr *p)

{
  Fts3Expr *p_local;
  
  if (p->eType == 1) {
    p_local._4_4_ = 1;
  }
  else if (p->eType == 4) {
    p_local._4_4_ = 2;
  }
  else {
    p_local._4_4_ = 3;
  }
  return p_local._4_4_;
}

Assistant:

static int opPrecedence(Fts3Expr *p){
  assert( p->eType!=FTSQUERY_PHRASE );
  if( sqlite3_fts3_enable_parentheses ){
    return p->eType;
  }else if( p->eType==FTSQUERY_NEAR ){
    return 1;
  }else if( p->eType==FTSQUERY_OR ){
    return 2;
  }
  assert( p->eType==FTSQUERY_AND );
  return 3;
}